

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandStarter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uint local_48;
  int fVerbose;
  int nCores;
  int c;
  char *pCommand;
  char *pFileName;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _nCores = (char *)0x0;
  local_48 = 3;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      while( true ) {
        iVar2 = Extra_UtilGetopt(argc,argv,"NCvh");
        if (iVar2 == -1) {
          if (argc != globalUtilOptind + 1) {
            Abc_Print(-2,"The file name should be given on the command line.\n");
            return 1;
          }
          pcVar3 = argv[globalUtilOptind];
          __stream = (FILE *)Io_FileOpen(pcVar3,"open_path","rb",0);
          if (__stream == (FILE *)0x0) {
            Abc_Print(-2,"Cannot open input file \"%s\". ",pcVar3);
            pcVar3 = Extra_FileGetSimilarName(pcVar3,".c",".s",".scr",".script",(char *)0x0);
            if (pcVar3 != (char *)0x0) {
              Abc_Print(-2,"Did you mean \"%s\"?",pcVar3);
            }
            Abc_Print(-2,"\n");
            return 1;
          }
          fclose(__stream);
          Cmd_RunStarter(pcVar3,pAbc->sBinary,_nCores,local_48);
          return 0;
        }
        if (iVar2 != 0x43) break;
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,
                    "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n"
                   );
          goto LAB_00330fc5;
        }
        _nCores = argv[globalUtilOptind];
        globalUtilOptind = globalUtilOptind + 1;
      }
      if (iVar2 == 0x4e) break;
      if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_00330fc5;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    local_48 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)local_48);
LAB_00330fc5:
  Abc_Print(-2,"usage: starter [-N num] [-C cmd] [-vh] <file>\n");
  Abc_Print(-2,"\t         runs command lines listed in <file> concurrently on <num> CPUs\n");
  Abc_Print(-2,"\t-N num : the number of concurrent jobs including the controler [default = %d]\n",
            (ulong)local_48);
  Abc_Print(-2,"\t-C cmd : (optional) ABC command line to execute on benchmarks in <file>\n");
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,
            "\t<file> : file name with ABC command lines (or benchmark names, if <cmd> is given)\n")
  ;
  return 1;
}

Assistant:

int CmdCommandStarter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores );
    FILE * pFile;
    char * pFileName;
    char * pCommand = NULL;
    int c, nCores    =  3;
    int fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCores = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCores < 0 ) 
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a string (possibly in quotes).\n" );
                goto usage;
            }
            pCommand = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -2, "The file name should be given on the command line.\n" );
        return 1;
    }
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( pFileName, "open_path", "rb", 0 )) == NULL )
//    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        Abc_Print( -2, "Cannot open input file \"%s\". ", pFileName );
        if (( pFileName = Extra_FileGetSimilarName( pFileName, ".c", ".s", ".scr", ".script", NULL ) ))
            Abc_Print( -2, "Did you mean \"%s\"?", pFileName );
        Abc_Print( -2, "\n" );
        return 1;
    }
    fclose( pFile );
    // run commands
    Cmd_RunStarter( pFileName, pAbc->sBinary, pCommand, nCores );
    return 0;

usage:
    Abc_Print( -2, "usage: starter [-N num] [-C cmd] [-vh] <file>\n" );
    Abc_Print( -2, "\t         runs command lines listed in <file> concurrently on <num> CPUs\n" );
    Abc_Print( -2, "\t-N num : the number of concurrent jobs including the controler [default = %d]\n", nCores );
    Abc_Print( -2, "\t-C cmd : (optional) ABC command line to execute on benchmarks in <file>\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with ABC command lines (or benchmark names, if <cmd> is given)\n");
    return 1;
}